

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_avx2.c
# Opt level: O0

uint64_t aom_var_2d_u16_avx2(uint8_t *src,int src_stride,int width,int height)

{
  ushort uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  __m256i vec_a;
  __m256i vec_a_00;
  __m256i vec_a_01;
  __m256i vec_a_02;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  int32_t iVar13;
  int in_ECX;
  long lVar14;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint16_t val;
  int m;
  int k_2;
  __m256i vsqs0_1;
  __m256i vsrc1_1;
  __m256i vsrc0_1;
  __m256i vsrc_1;
  __m256i vsqs0;
  __m256i vsrc1;
  __m256i vsrc0;
  int k_1;
  int k;
  __m256i vsrc [8];
  int j;
  int i;
  __m256i v_acc_sqs;
  __m256i v_acc_sum;
  __m256i vzero;
  uint64_t ss;
  uint64_t s;
  uint16_t *srcp;
  uint16_t *srcp1;
  undefined4 in_stack_fffffffffffff9b8;
  int iVar15;
  undefined4 in_stack_fffffffffffff9bc;
  int iVar16;
  undefined8 in_stack_fffffffffffff9c0;
  undefined8 in_stack_fffffffffffff9c8;
  longlong in_stack_fffffffffffff9d0;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  int local_548;
  int local_544;
  undefined8 local_540 [35];
  int local_428;
  int local_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  long local_3b8;
  long local_3b0;
  undefined1 (*local_3a8) [32];
  long local_3a0;
  int local_394;
  int local_390;
  int local_38c;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 (*local_350) [32];
  undefined1 (*local_348) [32];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  longlong lStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_3a0 = in_RDI * 2;
  local_3b0 = 0;
  local_3b8 = 0;
  local_380 = 0;
  uStack_378 = 0;
  uStack_370 = 0;
  uStack_368 = 0;
  local_3e0 = 0;
  uStack_3d8 = 0;
  uStack_3d0 = 0;
  uStack_3c8 = 0;
  local_400._0_16_ = ZEXT816(0);
  local_400 = ZEXT1632(local_400._0_16_);
  local_420._0_16_ = ZEXT816(0);
  local_420 = ZEXT1632(local_420._0_16_);
  local_394 = in_ECX;
  local_390 = in_EDX;
  local_38c = in_ESI;
  for (local_424 = 0; local_424 < local_390 + -0xf; local_424 = local_424 + 0x10) {
    local_3a8 = (undefined1 (*) [32])(local_3a0 + (long)local_424 * 2);
    for (local_428 = 0; local_428 < local_394 + -8; local_428 = local_428 + 8) {
      for (local_544 = 0; local_544 < 8; local_544 = local_544 + 1) {
        local_348 = local_3a8;
        uVar4 = *(undefined8 *)(*local_3a8 + 8);
        uVar5 = *(undefined8 *)(*local_3a8 + 0x10);
        uVar6 = *(undefined8 *)(*local_3a8 + 0x18);
        lVar14 = (long)local_544;
        local_540[lVar14 * 4] = *(undefined8 *)*local_3a8;
        local_540[lVar14 * 4 + 1] = uVar4;
        local_540[lVar14 * 4 + 2] = uVar5;
        local_540[lVar14 * 4 + 3] = uVar6;
        local_3a8 = (undefined1 (*) [32])(*local_3a8 + (long)local_38c * 2);
      }
      for (local_548 = 0; local_548 < 8; local_548 = local_548 + 1) {
        lVar14 = (long)local_548;
        local_e0 = local_540[lVar14 * 4];
        uStack_d8 = local_540[lVar14 * 4 + 1];
        uStack_d0 = local_540[lVar14 * 4 + 2];
        uStack_c8 = local_540[lVar14 * 4 + 3];
        local_100 = local_3e0;
        uStack_f8 = uStack_3d8;
        uStack_f0 = uStack_3d0;
        uStack_e8 = uStack_3c8;
        auVar9._8_8_ = uStack_d8;
        auVar9._0_8_ = local_e0;
        auVar9._16_8_ = uStack_d0;
        auVar9._24_8_ = uStack_c8;
        auVar8._8_8_ = uStack_3d8;
        auVar8._0_8_ = local_3e0;
        auVar8._16_8_ = uStack_3d0;
        auVar8._24_8_ = uStack_3c8;
        auVar3 = vpunpcklwd_avx2(auVar9,auVar8);
        lVar14 = (long)local_548;
        local_60 = local_540[lVar14 * 4];
        uStack_58 = local_540[lVar14 * 4 + 1];
        uStack_50 = local_540[lVar14 * 4 + 2];
        uStack_48 = local_540[lVar14 * 4 + 3];
        local_80 = local_3e0;
        uStack_78 = uStack_3d8;
        uStack_70 = uStack_3d0;
        uStack_68 = uStack_3c8;
        auVar12._8_8_ = uStack_58;
        auVar12._0_8_ = local_60;
        auVar12._16_8_ = uStack_50;
        auVar12._24_8_ = uStack_48;
        auVar11._8_8_ = uStack_3d8;
        auVar11._0_8_ = local_3e0;
        auVar11._16_8_ = uStack_3d0;
        auVar11._24_8_ = uStack_3c8;
        auVar2 = vpunpckhwd_avx2(auVar12,auVar11);
        local_580 = auVar3._0_8_;
        local_160 = local_580;
        uStack_578 = auVar3._8_8_;
        uStack_158 = uStack_578;
        uStack_570 = auVar3._16_8_;
        uStack_150 = uStack_570;
        uStack_568 = auVar3._24_8_;
        uStack_148 = uStack_568;
        local_180 = local_400._0_8_;
        uStack_178 = local_400._8_8_;
        uStack_170 = local_400._16_8_;
        uStack_168 = local_400._24_8_;
        auVar3 = vpaddd_avx2(auVar3,local_400);
        local_5a0 = auVar2._0_8_;
        local_1a0 = local_5a0;
        uStack_598 = auVar2._8_8_;
        uStack_198 = uStack_598;
        uStack_590 = auVar2._16_8_;
        uStack_190 = uStack_590;
        uStack_588 = auVar2._24_8_;
        uStack_188 = uStack_588;
        local_400._0_8_ = auVar3._0_8_;
        local_1c0 = local_400._0_8_;
        local_400._8_8_ = auVar3._8_8_;
        uStack_1b8 = local_400._8_8_;
        local_400._16_8_ = auVar3._16_8_;
        uStack_1b0 = local_400._16_8_;
        local_400._24_8_ = auVar3._24_8_;
        uStack_1a8 = local_400._24_8_;
        local_400 = vpaddd_avx2(auVar2,auVar3);
        lVar14 = (long)local_548;
        local_2e0 = local_540[lVar14 * 4];
        uStack_2d8 = local_540[lVar14 * 4 + 1];
        uStack_2d0 = local_540[lVar14 * 4 + 2];
        uStack_2c8 = local_540[lVar14 * 4 + 3];
        lVar14 = (long)local_548;
        local_300 = local_540[lVar14 * 4];
        uStack_2f8 = local_540[lVar14 * 4 + 1];
        uStack_2f0 = local_540[lVar14 * 4 + 2];
        uStack_2e8 = local_540[lVar14 * 4 + 3];
        auVar2._8_8_ = uStack_2d8;
        auVar2._0_8_ = local_2e0;
        auVar2._16_8_ = uStack_2d0;
        auVar2._24_8_ = uStack_2c8;
        auVar3._8_8_ = uStack_2f8;
        auVar3._0_8_ = local_300;
        auVar3._16_8_ = uStack_2f0;
        auVar3._24_8_ = uStack_2e8;
        auVar3 = vpmaddwd_avx2(auVar2,auVar3);
        local_1e0 = local_420._0_8_;
        uStack_1d8 = local_420._8_8_;
        uStack_1d0 = local_420._16_8_;
        uStack_1c8 = local_420._24_8_;
        local_5c0 = auVar3._0_8_;
        local_200 = local_5c0;
        uStack_5b8 = auVar3._8_8_;
        uStack_1f8 = uStack_5b8;
        uStack_5b0 = auVar3._16_8_;
        uStack_1f0 = uStack_5b0;
        uStack_5a8 = auVar3._24_8_;
        uStack_1e8 = uStack_5a8;
        local_420 = vpaddd_avx2(local_420,auVar3);
      }
      vec_a[0]._4_4_ = in_stack_fffffffffffff9bc;
      vec_a[0]._0_4_ = in_stack_fffffffffffff9b8;
      vec_a[1] = in_stack_fffffffffffff9c0;
      vec_a[2] = in_stack_fffffffffffff9c8;
      vec_a[3] = in_stack_fffffffffffff9d0;
      iVar13 = mm256_accumulate_epi32(vec_a);
      local_3b0 = iVar13 + local_3b0;
      vec_a_00[0]._4_4_ = in_stack_fffffffffffff9bc;
      vec_a_00[0]._0_4_ = in_stack_fffffffffffff9b8;
      vec_a_00[1] = in_stack_fffffffffffff9c0;
      vec_a_00[2] = in_stack_fffffffffffff9c8;
      vec_a_00[3] = in_stack_fffffffffffff9d0;
      iVar13 = mm256_accumulate_epi32(vec_a_00);
      local_3b8 = iVar13 + local_3b8;
      local_400._8_8_ = uStack_3d8;
      local_400._0_8_ = local_3e0;
      local_400._16_8_ = uStack_3d0;
      local_400._24_8_ = uStack_3c8;
      local_420._8_8_ = uStack_3d8;
      local_420._0_8_ = local_3e0;
      local_420._16_8_ = uStack_3d0;
      local_420._24_8_ = uStack_3c8;
    }
    for (; local_428 < local_394; local_428 = local_428 + 1) {
      local_350 = local_3a8;
      local_340 = *(undefined8 *)*local_3a8;
      uStack_338 = *(undefined8 *)(*local_3a8 + 8);
      uStack_330 = *(undefined8 *)(*local_3a8 + 0x10);
      uStack_328 = *(undefined8 *)(*local_3a8 + 0x18);
      local_140 = local_3e0;
      uStack_138 = uStack_3d8;
      uStack_130 = uStack_3d0;
      uStack_128 = uStack_3c8;
      auVar7._8_8_ = uStack_3d8;
      auVar7._0_8_ = local_3e0;
      auVar7._16_8_ = uStack_3d0;
      auVar7._24_8_ = uStack_3c8;
      auVar3 = vpunpcklwd_avx2(*local_3a8,auVar7);
      local_c0 = local_3e0;
      uStack_b8 = uStack_3d8;
      uStack_b0 = uStack_3d0;
      uStack_a8 = uStack_3c8;
      auVar10._8_8_ = uStack_3d8;
      auVar10._0_8_ = local_3e0;
      auVar10._16_8_ = uStack_3d0;
      auVar10._24_8_ = uStack_3c8;
      auVar2 = vpunpckhwd_avx2(*local_3a8,auVar10);
      local_600 = auVar3._0_8_;
      local_220 = local_600;
      uStack_5f8 = auVar3._8_8_;
      uStack_218 = uStack_5f8;
      uStack_5f0 = auVar3._16_8_;
      uStack_210 = uStack_5f0;
      uStack_5e8 = auVar3._24_8_;
      uStack_208 = uStack_5e8;
      local_240 = local_400._0_8_;
      uStack_238 = local_400._8_8_;
      uStack_230 = local_400._16_8_;
      uStack_228 = local_400._24_8_;
      auVar3 = vpaddd_avx2(auVar3,local_400);
      local_620 = auVar2._0_8_;
      local_260 = local_620;
      uStack_618 = auVar2._8_8_;
      uStack_258 = uStack_618;
      uStack_610 = auVar2._16_8_;
      uStack_250 = uStack_610;
      uStack_608 = auVar2._24_8_;
      uStack_248 = uStack_608;
      local_400._0_8_ = auVar3._0_8_;
      local_280 = local_400._0_8_;
      local_400._8_8_ = auVar3._8_8_;
      uStack_278 = local_400._8_8_;
      local_400._16_8_ = auVar3._16_8_;
      uStack_270 = local_400._16_8_;
      local_400._24_8_ = auVar3._24_8_;
      uStack_268 = local_400._24_8_;
      local_400 = vpaddd_avx2(auVar2,auVar3);
      auVar3 = vpmaddwd_avx2(*local_3a8,*local_3a8);
      in_stack_fffffffffffff9c0 = auVar3._0_8_;
      in_stack_fffffffffffff9c8 = auVar3._8_8_;
      in_stack_fffffffffffff9d0 = auVar3._16_8_;
      uStack_628 = auVar3._24_8_;
      local_2a0 = local_420._0_8_;
      uStack_298 = local_420._8_8_;
      uStack_290 = local_420._16_8_;
      uStack_288 = local_420._24_8_;
      uStack_2a8 = uStack_628;
      local_420 = vpaddd_avx2(local_420,auVar3);
      local_3a8 = (undefined1 (*) [32])(*local_3a8 + (long)local_38c * 2);
      local_320 = local_340;
      uStack_318 = uStack_338;
      uStack_310 = uStack_330;
      uStack_308 = uStack_328;
      local_2c0 = in_stack_fffffffffffff9c0;
      uStack_2b8 = in_stack_fffffffffffff9c8;
      lStack_2b0 = in_stack_fffffffffffff9d0;
      local_120 = local_340;
      uStack_118 = uStack_338;
      uStack_110 = uStack_330;
      uStack_108 = uStack_328;
      local_a0 = local_340;
      uStack_98 = uStack_338;
      uStack_90 = uStack_330;
      uStack_88 = uStack_328;
    }
    vec_a_01[0]._4_4_ = in_stack_fffffffffffff9bc;
    vec_a_01[0]._0_4_ = in_stack_fffffffffffff9b8;
    vec_a_01[1] = in_stack_fffffffffffff9c0;
    vec_a_01[2] = in_stack_fffffffffffff9c8;
    vec_a_01[3] = in_stack_fffffffffffff9d0;
    iVar13 = mm256_accumulate_epi32(vec_a_01);
    local_3b0 = iVar13 + local_3b0;
    vec_a_02[0]._4_4_ = in_stack_fffffffffffff9bc;
    vec_a_02[0]._0_4_ = in_stack_fffffffffffff9b8;
    vec_a_02[1] = in_stack_fffffffffffff9c0;
    vec_a_02[2] = in_stack_fffffffffffff9c8;
    vec_a_02[3] = in_stack_fffffffffffff9d0;
    iVar13 = mm256_accumulate_epi32(vec_a_02);
    local_3b8 = iVar13 + local_3b8;
    local_400._8_8_ = uStack_3d8;
    local_400._0_8_ = local_3e0;
    local_400._16_8_ = uStack_3d0;
    local_400._24_8_ = uStack_3c8;
    local_420._8_8_ = uStack_3d8;
    local_420._0_8_ = local_3e0;
    local_420._16_8_ = uStack_3d0;
    local_420._24_8_ = uStack_3c8;
  }
  local_3a8 = (undefined1 (*) [32])local_3a0;
  for (iVar16 = 0; iVar15 = local_424, iVar16 < local_394; iVar16 = iVar16 + 1) {
    for (; iVar15 < local_390; iVar15 = iVar15 + 1) {
      uVar1 = *(ushort *)((long)local_3a8 + (long)iVar15 * 2);
      local_3b0 = (ulong)uVar1 + local_3b0;
      local_3b8 = (int)((uint)uVar1 * (uint)uVar1) + local_3b8;
    }
    local_3a8 = (undefined1 (*) [32])((long)local_3a8 + (long)local_38c * 2);
  }
  return local_3b8 - (ulong)(local_3b0 * local_3b0) / (ulong)(long)(local_390 * local_394);
}

Assistant:

uint64_t aom_var_2d_u16_avx2(uint8_t *src, int src_stride, int width,
                             int height) {
  uint16_t *srcp1 = CONVERT_TO_SHORTPTR(src), *srcp;
  uint64_t s = 0, ss = 0;
  __m256i vzero = _mm256_setzero_si256();
  __m256i v_acc_sum = vzero;
  __m256i v_acc_sqs = vzero;
  int i, j;

  // Process 16 elements in a row
  for (i = 0; i < width - 15; i += 16) {
    srcp = srcp1 + i;
    // Process 8 columns at a time
    for (j = 0; j < height - 8; j += 8) {
      __m256i vsrc[8];
      for (int k = 0; k < 8; k++) {
        vsrc[k] = _mm256_loadu_si256((__m256i *)srcp);
        srcp += src_stride;
      }
      for (int k = 0; k < 8; k++) {
        __m256i vsrc0 = _mm256_unpacklo_epi16(vsrc[k], vzero);
        __m256i vsrc1 = _mm256_unpackhi_epi16(vsrc[k], vzero);
        v_acc_sum = _mm256_add_epi32(vsrc0, v_acc_sum);
        v_acc_sum = _mm256_add_epi32(vsrc1, v_acc_sum);

        __m256i vsqs0 = _mm256_madd_epi16(vsrc[k], vsrc[k]);
        v_acc_sqs = _mm256_add_epi32(v_acc_sqs, vsqs0);
      }

      // Update total sum and clear the vectors
      s += mm256_accumulate_epi32(v_acc_sum);
      ss += mm256_accumulate_epi32(v_acc_sqs);
      v_acc_sum = vzero;
      v_acc_sqs = vzero;
    }

    // Process remaining rows (height not a multiple of 8)
    for (; j < height; j++) {
      __m256i vsrc = _mm256_loadu_si256((__m256i *)srcp);
      __m256i vsrc0 = _mm256_unpacklo_epi16(vsrc, vzero);
      __m256i vsrc1 = _mm256_unpackhi_epi16(vsrc, vzero);
      v_acc_sum = _mm256_add_epi32(vsrc0, v_acc_sum);
      v_acc_sum = _mm256_add_epi32(vsrc1, v_acc_sum);

      __m256i vsqs0 = _mm256_madd_epi16(vsrc, vsrc);
      v_acc_sqs = _mm256_add_epi32(v_acc_sqs, vsqs0);
      srcp += src_stride;
    }

    // Update total sum and clear the vectors
    s += mm256_accumulate_epi32(v_acc_sum);
    ss += mm256_accumulate_epi32(v_acc_sqs);
    v_acc_sum = vzero;
    v_acc_sqs = vzero;
  }

  // Process the remaining area using C
  srcp = srcp1;
  for (int k = 0; k < height; k++) {
    for (int m = i; m < width; m++) {
      uint16_t val = srcp[m];
      s += val;
      ss += val * val;
    }
    srcp += src_stride;
  }
  return (ss - s * s / (width * height));
}